

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O1

bool __thiscall
MissingDependencyScanner::PathExistsBetween(MissingDependencyScanner *this,Edge *from,Edge *to)

{
  _Hash_node_base *p_Var1;
  long *plVar2;
  Edge *to_00;
  bool bVar3;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  _Var4;
  long lVar5;
  pointer ppNVar6;
  ulong uVar7;
  byte bVar8;
  __node_base_ptr p_Var9;
  long *plVar10;
  __node_base_ptr p_Var11;
  long *plVar12;
  ulong uVar13;
  pair<std::__detail::_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>,_bool>
  pVar14;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  Edge *local_70;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  uVar13 = (this->adjacency_map_)._M_h._M_bucket_count;
  uVar7 = (ulong)from % uVar13;
  p_Var9 = (this->adjacency_map_)._M_h._M_buckets[uVar7];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var9->_M_nxt, p_Var11 = p_Var9, (Edge *)p_Var9->_M_nxt[1]._M_nxt != from)) {
    while (p_Var9 = p_Var1, p_Var1 = p_Var9->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % uVar13 != uVar7) ||
         (p_Var11 = p_Var9, (Edge *)p_Var1[1]._M_nxt == from)) goto LAB_0011d165;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_0011d165:
  if (p_Var11 == (__node_base_ptr)0x0) {
    _Var4._M_cur = (__node_type *)0x0;
  }
  else {
    _Var4._M_cur = (__node_type *)p_Var11->_M_nxt;
  }
  if (_Var4._M_cur == (__node_type *)0x0) {
    local_a8._M_buckets = &local_a8._M_single_bucket;
    local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a8._M_element_count = 0;
    local_a8._M_bucket_count = 1;
    local_a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_a8._M_rehash_policy._4_4_ = 0;
    local_a8._M_rehash_policy._M_next_resize = 0;
    local_a8._M_single_bucket = (__node_base_ptr)0x0;
    local_70 = from;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,&local_a8);
    pVar14 = std::
             _Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::
             _M_emplace<std::pair<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>
                       ((_Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->adjacency_map_,&local_70);
    _Var4._M_cur = (__node_type *)
                   pVar14.first.
                   super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                   ._M_cur;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a8);
  }
  else {
    uVar13 = *(ulong *)((long)&((_Var4._M_cur)->
                               super__Hash_node_value<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>
                               ._M_storage._M_storage + 0x10);
    uVar7 = (ulong)to % uVar13;
    plVar10 = *(long **)(*(long *)((long)&((_Var4._M_cur)->
                                          super__Hash_node_value<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                                          ).
                                          super__Hash_node_value_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>
                                          ._M_storage._M_storage + 8) + uVar7 * 8);
    plVar12 = (long *)0x0;
    if ((plVar10 != (long *)0x0) &&
       (plVar2 = (long *)*plVar10, plVar12 = plVar10, (Edge *)((long *)*plVar10)[1] != to)) {
      while (plVar10 = plVar2, plVar2 = (long *)*plVar10, plVar2 != (long *)0x0) {
        plVar12 = (long *)0x0;
        if (((ulong)plVar2[1] % uVar13 != uVar7) || (plVar12 = plVar10, (Edge *)plVar2[1] == to))
        goto LAB_0011d251;
      }
      plVar12 = (long *)0x0;
    }
LAB_0011d251:
    if (plVar12 == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = *plVar12;
    }
    if (lVar5 != 0) {
      bVar8 = *(byte *)(lVar5 + 0x10);
      goto LAB_0011d2cf;
    }
  }
  ppNVar6 = (to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar6) {
    uVar13 = 0;
    do {
      to_00 = ppNVar6[uVar13]->in_edge_;
      if ((to_00 != (Edge *)0x0) &&
         ((bVar8 = 1, to_00 == from || (bVar3 = PathExistsBetween(this,from,to_00), bVar3))))
      goto LAB_0011d2b7;
      uVar13 = uVar13 + 1;
      ppNVar6 = (to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(to->inputs_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3));
  }
  bVar8 = 0;
LAB_0011d2b7:
  local_70 = to;
  local_68._M_buckets._0_1_ = bVar8;
  std::
  _Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Edge*,bool>>
            ((_Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((long)&((_Var4._M_cur)->
                        super__Hash_node_value<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>
                        ._M_storage._M_storage + 8));
LAB_0011d2cf:
  return (bool)(bVar8 & 1);
}

Assistant:

bool MissingDependencyScanner::PathExistsBetween(Edge* from, Edge* to) {
  AdjacencyMap::iterator it = adjacency_map_.find(from);
  if (it != adjacency_map_.end()) {
    InnerAdjacencyMap::iterator inner_it = it->second.find(to);
    if (inner_it != it->second.end()) {
      return inner_it->second;
    }
  } else {
    it = adjacency_map_.insert(std::make_pair(from, InnerAdjacencyMap())).first;
  }
  bool found = false;
  for (size_t i = 0; i < to->inputs_.size(); ++i) {
    Edge* e = to->inputs_[i]->in_edge();
    if (e && (e == from || PathExistsBetween(from, e))) {
      found = true;
      break;
    }
  }
  it->second.insert(std::make_pair(to, found));
  return found;
}